

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_header.hpp
# Opt level: O1

void pstore::serialize::serializer<pstore::extent<unsigned_char>,void>::
     read<pstore::serialize::archive::database_reader&>(database_reader *archive,value_type *r)

{
  typed_address<unsigned_char> tVar1;
  address in_RAX;
  type uninit_buffer;
  undefined1 in_stack_00000008 [16];
  typed_address<unsigned_char> local_28;
  
  local_28.a_.a_ = (address)(address)in_RAX.a_;
  flood<_1l>((span<unsigned_char,__1L>)in_stack_00000008);
  serialize::archive::database_reader::get<unsigned_long,void>(archive,(unsigned_long *)&local_28);
  tVar1.a_.a_ = local_28.a_.a_;
  flood<_1l>((span<unsigned_char,__1L>)in_stack_00000008);
  serialize::archive::database_reader::get<unsigned_long,void>(archive,(unsigned_long *)&local_28);
  (r->addr).a_.a_ = (value_type)tVar1.a_.a_;
  r->size = (uint64_t)local_28.a_.a_;
  return;
}

Assistant:

static void read (Archive && archive, value_type & r) {
                auto const addr = typed_address<T>::make (serialize::read<std::uint64_t> (archive));
                auto const size = serialize::read<std::uint64_t> (archive);
                new (&r) extent<T> (addr, size);
            }